

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O2

bool __thiscall ON_3dmViewTraceImage::Write(ON_3dmViewTraceImage *this,ON_BinaryArchive *file)

{
  bool bVar1;
  int iVar2;
  ON_wString *s;
  
  iVar2 = ON_BinaryArchive::Archive3dmVersion(file);
  bVar1 = ON_BinaryArchive::Write3dmChunkVersion(file,1,(0x3b < iVar2) + 3);
  if (bVar1) {
    s = ON_FileReference::FullPath(&this->m_image_file_reference);
    bVar1 = ON_BinaryArchive::WriteString(file,s);
    if ((((bVar1) && (bVar1 = ON_BinaryArchive::WriteDouble(file,this->m_width), bVar1)) &&
        (bVar1 = ON_BinaryArchive::WriteDouble(file,this->m_height), bVar1)) &&
       (((bVar1 = ON_BinaryArchive::WritePlane(file,&this->m_plane), bVar1 &&
         (bVar1 = ON_BinaryArchive::WriteBool(file,this->m_bGrayScale), bVar1)) &&
        (bVar1 = ON_BinaryArchive::WriteBool(file,this->m_bHidden), bVar1)))) {
      bVar1 = ON_BinaryArchive::WriteBool(file,this->m_bFiltered);
      if (!bVar1 || iVar2 < 0x3c) {
        return bVar1;
      }
      bVar1 = ON_FileReference::Write(&this->m_image_file_reference,true,file);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool ON_3dmViewTraceImage::Write( ON_BinaryArchive& file ) const
{
  // opennurbs version  < 200307300 - version 1.0 or 1.1 chunk
  // opennurbs version >= 200307300 - version 1.2 chunk
  const int minor_version = (file.Archive3dmVersion() >= 60) ? 4 : 3;
  bool rc = file.Write3dmChunkVersion(1,minor_version);
  if (rc) 
  {
    if (rc) rc = file.WriteString( m_image_file_reference.FullPath() );
    if (rc) rc = file.WriteDouble( m_width );
    if (rc) rc = file.WriteDouble( m_height );
    if (rc) rc = file.WritePlane( m_plane );

    // version 1.1
    if (rc) rc = file.WriteBool( m_bGrayScale );

    // version 1.2
    if (rc) rc = file.WriteBool( m_bHidden );
    
    // version 1.3
    if (rc) rc = file.WriteBool( m_bFiltered );

    if (rc && minor_version >= 4)
    {
      // version 1.4
      if (rc) rc = m_image_file_reference.Write(true, file);
    }
  }
  return rc;
}